

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O1

void PlayingState::CmdAdvancedPrompt
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  Connection *pCVar1;
  int iVar2;
  undefined1 *puVar3;
  shared_ptr<Player> player;
  stringstream ss;
  undefined8 *local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  Connection::GetPlayer
            ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Advanced Prompt ",0x10);
  iVar2 = std::__cxx11::string::compare((char *)input);
  pCVar1 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (iVar2 == 0) {
    Connection::AdvancedPrompt(pCVar1,false);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"off",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,Format::NL_abi_cxx11_._M_dataplus._M_p,
               Format::NL_abi_cxx11_._M_string_length);
    std::__cxx11::stringbuf::str();
    (**(code **)*local_1f0)(local_1f0,local_1c0);
    puVar3 = local_1b0;
  }
  else {
    Connection::AdvancedPrompt(pCVar1,true);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"on",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,Format::NL_abi_cxx11_._M_dataplus._M_p,
               Format::NL_abi_cxx11_._M_string_length);
    std::__cxx11::stringbuf::str();
    (**(code **)*local_1f0)(local_1f0,local_1e0);
    puVar3 = local_1d0;
  }
  if (*(undefined1 **)(puVar3 + -0x10) != puVar3) {
    operator_delete(*(undefined1 **)(puVar3 + -0x10));
  }
  pCVar1 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = std::__cxx11::string::compare((char *)input);
  Connection::AdvancedPrompt(pCVar1,iVar2 != 0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
  }
  return;
}

Assistant:

void PlayingState::CmdAdvancedPrompt(const std::string &input, std::shared_ptr<Connection> connection,
                                    std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    std::stringstream ss;
    ss << "Advanced Prompt ";
    if(input == "off") {
        connection->AdvancedPrompt(false);
        ss << "off" << Format::NL;
        player->Send(ss.str());
    } else {
        connection->AdvancedPrompt(true);
        ss << "on" << Format::NL;
        player->Send(ss.str());
    }
    connection->AdvancedPrompt(input != "off");
}